

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O1

Gia_Man_t * Abc_NtkAigToGiaTwo(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fByName)

{
  Abc_Obj_t *pObj;
  Nm_Man_t *pNVar1;
  Vec_Ptr_t *pVVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *vMap;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  char *pcVar8;
  Gia_Man_t *p;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  Vec_Int_t *local_40;
  
  if ((pNtk1->ntkFunc != ABC_FUNC_AIG) || (pNtk1->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsAigLogic(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress3.c"
                  ,0x7f,"Gia_Man_t *Abc_NtkAigToGiaTwo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  if ((pNtk2->ntkFunc != ABC_FUNC_AIG) || (pNtk2->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsAigLogic(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress3.c"
                  ,0x80,"Gia_Man_t *Abc_NtkAigToGiaTwo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  pVVar7 = pNtk1->vCis;
  uVar17 = pVVar7->nSize;
  vMap = (Vec_Int_t *)malloc(0x10);
  uVar5 = 0x10;
  if (0xe < uVar17 - 1) {
    uVar5 = uVar17;
  }
  vMap->nSize = 0;
  vMap->nCap = uVar5;
  if (fByName == 0) {
    if (uVar5 == 0) {
      piVar6 = (int *)0x0;
    }
    else {
      piVar6 = (int *)malloc((long)(int)uVar5 << 2);
    }
    vMap->pArray = piVar6;
    vMap->nSize = uVar17;
    if (0 < (int)uVar17) {
      uVar12 = 0;
      do {
        piVar6[uVar12] = (int)uVar12;
        uVar12 = uVar12 + 1;
      } while (uVar17 != uVar12);
    }
    pVVar2 = pNtk2->vCis;
    uVar5 = pVVar2->nSize;
    uVar12 = (ulong)uVar5;
    local_40 = (Vec_Int_t *)malloc(0x10);
    uVar14 = 0x10;
    if (0xe < uVar5 - 1) {
      uVar14 = uVar5;
    }
    local_40->nSize = 0;
    local_40->nCap = uVar14;
    if (uVar14 == 0) {
      piVar6 = (int *)0x0;
    }
    else {
      piVar6 = (int *)malloc((long)(int)uVar14 << 2);
    }
    local_40->pArray = piVar6;
    local_40->nSize = uVar5;
    if (0 < (int)uVar5) {
      uVar13 = 0;
      do {
        piVar6[uVar13] = (int)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
    }
    if ((int)uVar5 < (int)uVar17) {
      uVar12 = (ulong)uVar17;
    }
    uVar17 = pVVar7->nSize;
    uVar5 = pVVar2->nSize;
    if ((int)uVar17 < (int)uVar5) {
      uVar5 = uVar17;
    }
    printf("Matched %d vars by order.",(ulong)uVar5);
    if (pNtk1->vCis->nSize < pNtk2->vCis->nSize) {
      printf(" The last %d vars of Netlist2 are unmatched vars.");
    }
    if (pNtk1->vCis->nSize <= pNtk2->vCis->nSize) goto LAB_002b7256;
    pcVar8 = " The last %d vars of Netlist1 are unmatched vars.";
  }
  else {
    if (uVar5 == 0) {
      piVar6 = (int *)0x0;
    }
    else {
      piVar6 = (int *)malloc((long)(int)uVar5 << 2);
    }
    vMap->pArray = piVar6;
    vMap->nSize = uVar17;
    if (0 < (int)uVar17) {
      uVar12 = 0;
      do {
        piVar6[uVar12] = (int)uVar12;
        uVar12 = uVar12 + 1;
      } while (uVar17 != uVar12);
    }
    iVar15 = pNtk2->vCis->nSize;
    local_40 = (Vec_Int_t *)malloc(0x10);
    iVar4 = 0x10;
    if (0xe < iVar15 - 1U) {
      iVar4 = iVar15;
    }
    local_40->nSize = 0;
    local_40->nCap = iVar4;
    uVar12 = 0;
    if (iVar4 == 0) {
      piVar6 = (int *)0x0;
    }
    else {
      piVar6 = (int *)malloc((long)iVar4 << 2);
    }
    local_40->pArray = piVar6;
    pVVar7 = pNtk1->vCis;
    iVar15 = pVVar7->nSize;
    if (0 < iVar15) {
      uVar12 = 0;
      do {
        *(int *)((long)pVVar7->pArray[uVar12] + 0x40) = (int)uVar12;
        uVar12 = uVar12 + 1;
        pVVar7 = pNtk1->vCis;
        iVar15 = pVVar7->nSize;
      } while ((long)uVar12 < (long)iVar15);
    }
    if ((int)uVar12 != iVar15) {
      __assert_fail("Index == Abc_NtkCiNum(pNtk1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress3.c"
                    ,0x89,"Gia_Man_t *Abc_NtkAigToGiaTwo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
    }
    pVVar7 = pNtk2->vCis;
    if (pVVar7->nSize < 1) {
      uVar17 = 0;
    }
    else {
      lVar16 = 0;
      uVar17 = 0;
      do {
        pObj = (Abc_Obj_t *)pVVar7->pArray[lVar16];
        pNVar1 = pNtk1->pManName;
        pcVar8 = Abc_ObjName(pObj);
        uVar5 = Nm_ManFindIdByName(pNVar1,pcVar8,2);
        if ((int)uVar5 < 0) {
          pNVar1 = pNtk1->pManName;
          pcVar8 = Abc_ObjName(pObj);
          uVar5 = Nm_ManFindIdByName(pNVar1,pcVar8,5);
        }
        if (-1 < (int)uVar5) {
          if (pNtk1->vObjs->nSize <= (int)uVar5) goto LAB_002b748c;
          uVar14 = *(uint *)((long)pNtk1->vObjs->pArray[uVar5] + 0x14) & 0xf;
          if ((uVar14 != 2) && (uVar14 != 5)) {
            __assert_fail("Num < 0 || Abc_ObjIsCi(Abc_NtkObj(pNtk1, Num))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress3.c"
                          ,0x8f,"Gia_Man_t *Abc_NtkAigToGiaTwo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
          }
        }
        if ((int)uVar5 < 0) {
          Vec_IntPush(local_40,(int)uVar12);
          uVar12 = (ulong)((int)uVar12 + 1);
        }
        else {
          if (pNtk1->vObjs->nSize <= (int)uVar5) {
LAB_002b748c:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          Vec_IntPush(local_40,*(int *)((long)pNtk1->vObjs->pArray[uVar5] + 0x40));
          uVar17 = uVar17 + 1;
        }
        lVar16 = lVar16 + 1;
        pVVar7 = pNtk2->vCis;
      } while (lVar16 < pVVar7->nSize);
    }
    printf("Matched %d vars by name.",(ulong)uVar17);
    if (pNtk1->vCis->nSize != uVar17) {
      printf(" Netlist1 has %d unmatched vars.");
    }
    if (pNtk2->vCis->nSize == uVar17) goto LAB_002b7256;
    pcVar8 = " Netlist2 has %d unmatched vars.";
  }
  printf(pcVar8);
LAB_002b7256:
  putchar(10);
  p = Gia_ManStart(10000);
  pcVar8 = pNtk1->pName;
  if (pcVar8 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar8);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar8);
  }
  p->pName = pcVar10;
  pcVar8 = pNtk1->pSpec;
  if (pcVar8 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar8);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar8);
  }
  p->pSpec = pcVar10;
  if (0 < (int)uVar12) {
    do {
      pGVar11 = Gia_ManAppendObj(p);
      uVar13 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p->pObjs;
      if ((pGVar11 < pGVar3) || (pGVar3 + p->nObjs <= pGVar11)) {
LAB_002b746d:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * -0x55555555);
      if ((pGVar11 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar11)) goto LAB_002b746d;
      uVar17 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar17;
    } while (uVar17 != 0);
  }
  Gia_ManHashAlloc(p);
  Abc_NtkAigToGiaOne(p,pNtk1,vMap);
  Abc_NtkAigToGiaOne(p,pNtk2,local_40);
  Gia_ManHashStop(p);
  if (vMap->pArray != (int *)0x0) {
    free(vMap->pArray);
    vMap->pArray = (int *)0x0;
  }
  free(vMap);
  if (local_40->pArray != (int *)0x0) {
    free(local_40->pArray);
    local_40->pArray = (int *)0x0;
  }
  free(local_40);
  Gia_ManCreateValueRefs(p);
  if (0 < p->nObjs) {
    iVar15 = 0;
    lVar16 = 4;
    lVar18 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) {
        return p;
      }
      uVar17 = *(uint *)((long)pGVar3 + lVar16 * 2 + -8);
      if (((~uVar17 & 0x1fffffff) != 0 && -1 < (int)uVar17) &&
         (*(int *)(&pGVar3->field_0x0 + lVar16 * 2) == 0)) {
        Gia_ManAppendCo(p,iVar15);
      }
      lVar18 = lVar18 + 1;
      iVar15 = iVar15 + 2;
      lVar16 = lVar16 + 6;
    } while (lVar18 < p->nObjs);
  }
  return p;
}

Assistant:

Gia_Man_t * Abc_NtkAigToGiaTwo( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fByName )
{
    Gia_Man_t * p;
    Gia_Obj_t * pObj;
    Abc_Obj_t * pNode;
    Vec_Int_t * vMap1, * vMap2;
    int i, Index = 0;
    assert( Abc_NtkIsAigLogic(pNtk1) );
    assert( Abc_NtkIsAigLogic(pNtk2) );
    // find common variables
    if ( fByName )
    {
        int nCommon = 0;
        vMap1 = Vec_IntStartNatural( Abc_NtkCiNum(pNtk1) );
        vMap2 = Vec_IntAlloc( Abc_NtkCiNum(pNtk2) );
        Abc_NtkForEachCi( pNtk1, pNode, i )
            pNode->iTemp = Index++;
        assert( Index == Abc_NtkCiNum(pNtk1) );
        Abc_NtkForEachCi( pNtk2, pNode, i )
        {
            int Num = Nm_ManFindIdByName( pNtk1->pManName, Abc_ObjName(pNode), ABC_OBJ_PI );
            if ( Num < 0 )
                Num = Nm_ManFindIdByName( pNtk1->pManName, Abc_ObjName(pNode), ABC_OBJ_BO );
            assert( Num < 0 || Abc_ObjIsCi(Abc_NtkObj(pNtk1, Num)) );
            if ( Num >= 0 )
                Vec_IntPush( vMap2, Abc_NtkObj(pNtk1, Num)->iTemp ), nCommon++;
            else
                Vec_IntPush( vMap2, Index++ );
        }
        // report
        printf( "Matched %d vars by name.", nCommon );
        if ( nCommon != Abc_NtkCiNum(pNtk1) )
            printf( " Netlist1 has %d unmatched vars.", Abc_NtkCiNum(pNtk1) - nCommon );
        if ( nCommon != Abc_NtkCiNum(pNtk2) )
            printf( " Netlist2 has %d unmatched vars.", Abc_NtkCiNum(pNtk2) - nCommon );
        printf( "\n" );
    }
    else
    {
        vMap1 = Vec_IntStartNatural( Abc_NtkCiNum(pNtk1) );
        vMap2 = Vec_IntStartNatural( Abc_NtkCiNum(pNtk2) );
        Index = Abc_MaxInt( Vec_IntSize(vMap1), Vec_IntSize(vMap2) );
        // report
        printf( "Matched %d vars by order.", Abc_MinInt(Abc_NtkCiNum(pNtk1), Abc_NtkCiNum(pNtk2)) );
        if ( Abc_NtkCiNum(pNtk1) < Abc_NtkCiNum(pNtk2) )
            printf( " The last %d vars of Netlist2 are unmatched vars.", Abc_NtkCiNum(pNtk2) - Abc_NtkCiNum(pNtk1) );
        if ( Abc_NtkCiNum(pNtk1) > Abc_NtkCiNum(pNtk2) )
            printf( " The last %d vars of Netlist1 are unmatched vars.", Abc_NtkCiNum(pNtk1) - Abc_NtkCiNum(pNtk2) );
        printf( "\n" );
    }
    // create new manager
    p = Gia_ManStart( 10000 );
    p->pName = Abc_UtilStrsav( Abc_NtkName(pNtk1) );
    p->pSpec = Abc_UtilStrsav( Abc_NtkSpec(pNtk1) );
    for ( i = 0; i < Index; i++ )
        Gia_ManAppendCi(p);
    // add logic
    Gia_ManHashAlloc( p );
    Abc_NtkAigToGiaOne( p, pNtk1, vMap1 );
    Abc_NtkAigToGiaOne( p, pNtk2, vMap2 );
    Gia_ManHashStop( p );
    Vec_IntFree( vMap1 );
    Vec_IntFree( vMap2 );
    // add extra POs to dangling nodes
    Gia_ManCreateValueRefs( p );
    Gia_ManForEachAnd( p, pObj, i )
        if ( pObj->Value == 0 )
            Gia_ManAppendCo( p, Abc_Var2Lit(i, 0) );
    return p;
}